

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  ulong uVar1;
  undefined8 uVar2;
  sysbvm_tuple_t sVar3;
  intptr_t iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = *(ulong *)(dictionary + 0x18);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar6 = *(uint *)(uVar1 + 0xc) >> 3;
  }
  else {
    uVar6 = 0;
  }
  uVar7 = 8;
  if (7 < uVar6) {
    uVar7 = (ulong)(uVar6 & 0xfffffffe);
  }
  sVar3 = sysbvm_array_create(context,(ulong)(uint)((int)uVar7 * 2));
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar3;
  if (uVar7 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)(sVar3 + 0x10 + lVar5) = 0x3f;
      lVar5 = lVar5 + 0x10;
    } while (uVar7 * 0x10 != lVar5);
  }
  if (1 < uVar6) {
    uVar7 = 0;
    do {
      sVar3 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7);
      if (sVar3 != 0x3f) {
        uVar2 = *(undefined8 *)(uVar1 + 0x18 + uVar7);
        iVar4 = sysbvm_methodDictionary_scanFor(dictionary,sVar3);
        if (iVar4 < 0) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dictionary.c:662: assertion failure: elementIndex >= 0"
                    );
        }
        lVar5 = *(long *)(dictionary + 0x18);
        *(sysbvm_tuple_t *)(lVar5 + 0x10 + iVar4 * 0x10) = sVar3;
        *(undefined8 *)(lVar5 + 0x18 + iVar4 * 0x10) = uVar2;
      }
      uVar7 = uVar7 + 0x10;
    } while ((uVar6 >> 1) << 4 != uVar7);
  }
  return;
}

Assistant:

static void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity*2);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i*2] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t key = oldStorage->elements[i*2];
        sysbvm_tuple_t value = oldStorage->elements[i*2 + 1];
        if(key != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_methodDictionary_insertNoCheck(dictionary, key, value);
    }
}